

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserialize_row.h
# Opt level: O0

vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
* psql::deserialize_row
            (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
             *__return_storage_ptr__,
            vector<psql::field_metadata,_std::allocator<psql::field_metadata>_> *meta,
            bytestring *buffer)

{
  undefined1 this [8];
  size_t sVar1;
  bool bVar2;
  uchar *first;
  uchar *puVar3;
  size_type sVar4;
  size_type sVar5;
  system_error *psVar6;
  uint8_t *from;
  const_reference pvVar7;
  field_metadata *in_R8;
  error_code ec;
  string_view from_00;
  value local_b0;
  undefined1 auStack_98 [8];
  string_view buff;
  void *local_78;
  variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>
  local_70 [28];
  int local_54;
  int local_50;
  int32_t size;
  int i;
  undefined1 local_39;
  errc local_38;
  short local_32;
  errc err;
  int16_t field_count;
  deserialization_context ctx;
  bytestring *buffer_local;
  vector<psql::field_metadata,_std::allocator<psql::field_metadata>_> *meta_local;
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  *res;
  
  ctx.last_ = (uint8_t *)buffer;
  first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(buffer);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ctx.last_);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ctx.last_);
  deserialization_context::deserialization_context
            ((deserialization_context *)&err,first,puVar3 + sVar4);
  local_32 = 0;
  local_38 = deserialize<short>(&local_32,(deserialization_context *)&err);
  check_error_code(local_38);
  sVar4 = (size_type)local_32;
  sVar5 = std::vector<psql::field_metadata,_std::allocator<psql::field_metadata>_>::size(meta);
  if (sVar4 != sVar5) {
    __assert_fail("field_count == meta.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/anarthal[P]postgres-asio/include/psql/deserialize_row.h"
                  ,0x3d,
                  "std::vector<value> psql::deserialize_row(const std::vector<field_metadata> &, const bytestring &)"
                 );
  }
  local_39 = 0;
  std::
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  ::reserve(__return_storage_ptr__,(long)local_32);
  local_50 = 0;
  do {
    if (local_32 <= local_50) {
      bVar2 = deserialization_context::empty((deserialization_context *)&err);
      if (bVar2) {
        return __return_storage_ptr__;
      }
      psVar6 = (system_error *)__cxa_allocate_exception(0x40);
      ec = make_error_code(extra_bytes);
      boost::system::system_error::system_error(psVar6,ec);
      __cxa_throw(psVar6,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    local_54 = 0;
    local_38 = deserialize<int>(&local_54,(deserialization_context *)&err);
    check_error_code(local_38);
    if (local_54 == -1) {
      local_78 = (void *)0x0;
      std::
      variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>
      ::variant<decltype(nullptr),void,void,decltype(nullptr),void>(local_70,&local_78);
      std::
      vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_70);
    }
    else {
      bVar2 = deserialization_context::enough_size((deserialization_context *)&err,(long)local_54);
      if (!bVar2) {
        psVar6 = (system_error *)__cxa_allocate_exception(0x40);
        join_0x00000010_0x00000000_ = make_error_code(incomplete_message);
        boost::system::system_error::system_error(psVar6,join_0x00000010_0x00000000_);
        __cxa_throw(psVar6,&boost::system::system_error::typeinfo,
                    boost::system::system_error::~system_error);
      }
      from = deserialization_context::first((deserialization_context *)&err);
      _auStack_98 = get_string(from,(long)local_54);
      this = auStack_98;
      sVar1 = buff._M_len;
      pvVar7 = std::vector<psql::field_metadata,_std::allocator<psql::field_metadata>_>::operator[]
                         (meta,(long)local_50);
      from_00._M_str = (char *)pvVar7;
      from_00._M_len = sVar1;
      deserialize_single(&local_b0,(psql *)this,from_00,in_R8);
      std::
      vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
      ::push_back(__return_storage_ptr__,&local_b0);
      deserialization_context::advance((deserialization_context *)&err,(long)local_54);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

inline std::vector<value> deserialize_row(
	const std::vector<field_metadata>& meta,
	const bytestring& buffer
)
{
	// Context
	deserialization_context ctx (buffer.data(), buffer.data() + buffer.size());

	// Field count
	std::int16_t field_count = 0;
	auto err = deserialize(field_count, ctx);
	check_error_code(err);
	assert(field_count == meta.size());

	// Each field
	std::vector<value> res;
	res.reserve(field_count);
	for (int i = 0; i < field_count; ++i)
	{
		std::int32_t size = 0;
		err = deserialize(size, ctx);
		check_error_code(err);
		if (size == -1)
		{
			// NULL
			res.push_back(value(nullptr));
		}
		else
		{
			if (!ctx.enough_size(size))
				throw boost::system::system_error(make_error_code(errc::incomplete_message));
			std::string_view buff = get_string(ctx.first(), size);
			res.push_back(deserialize_single(buff, meta[i]));
			ctx.advance(size);
		}
	}
	if (!ctx.empty())
		throw boost::system::system_error(make_error_code(errc::extra_bytes));
	return res;
}